

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

vector<int> * __thiscall vector<int>::operator=(vector<int> *this,vector<int> *other)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  int *__s;
  long lVar4;
  ulong __n;
  
  iVar1 = other->_size;
  this->_size = iVar1;
  iVar2 = other->_capacity;
  this->_capacity = iVar2;
  __n = 0xffffffffffffffff;
  if (-1 < (long)iVar2) {
    __n = (long)iVar2 * 4;
  }
  __s = (int *)operator_new__(__n);
  memset(__s,0,__n);
  this->vect = __s;
  piVar3 = other->vect;
  for (lVar4 = 0; lVar4 < iVar1; lVar4 = lVar4 + 1) {
    __s[lVar4] = piVar3[lVar4];
  }
  return this;
}

Assistant:

vector &operator = (const vector &other) {
        _size = other._size;
        _capacity = other._capacity;
        vect = new T[_capacity]();

        for (int i = 0; i < _size; ++i) {
            vect[i] = other[i];
        }

        return *this;
    }